

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O0

MPP_RET mpp_dec_notify(MppDec ctx,RK_U32 flag)

{
  MPP_RET local_24;
  MPP_RET ret;
  MppDecImpl *dec;
  RK_U32 flag_local;
  MppDec ctx_local;
  
  local_24 = MPP_OK;
  if ((mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p in flag %08x\n","mpp_dec_notify",ctx,(ulong)flag);
  }
  if ((*(long *)((long)ctx + 0x218) != 0) && ((flag & 0x400) != 0)) {
    dec_vproc_signal(*(MppDecVprocCtx *)((long)ctx + 0x218));
  }
  if ((*(long *)((long)ctx + 8) != 0) && (*(long *)(*(long *)((long)ctx + 8) + 0x18) != 0)) {
    local_24 = (**(code **)(*(long *)((long)ctx + 8) + 0x18))(ctx,flag);
  }
  if ((mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p out ret %d\n","mpp_dec_notify",ctx,(ulong)(uint)local_24);
  }
  return local_24;
}

Assistant:

MPP_RET mpp_dec_notify(MppDec ctx, RK_U32 flag)
{
    MppDecImpl *dec = (MppDecImpl *)ctx;
    MPP_RET ret = MPP_OK;

    dec_dbg_func("%p in flag %08x\n", dec, flag);

    if (dec->vproc && (flag & MPP_DEC_NOTIFY_BUFFER_MATCH))
        dec_vproc_signal(dec->vproc);

    if (dec->api && dec->api->notify)
        ret = dec->api->notify(dec, flag);

    dec_dbg_func("%p out ret %d\n", dec, ret);

    return ret;
}